

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::PickerPrivate::computeStringWidth(PickerPrivate *this)

{
  int iVar1;
  int iVar2;
  int extraout_EDX;
  int index;
  QWidget local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  
  this->maxStringWidth = 0x19;
  iVar1 = Picker::count(this->q);
  if (0 < iVar1) {
    QWidget::fontMetrics(local_50);
    for (index = 0; iVar1 != index; index = index + 1) {
      Picker::itemText((QString *)&local_48,this->q,index);
      iVar2 = QFontMetrics::boundingRect((QString *)local_50);
      iVar2 = (extraout_EDX - iVar2) + 1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      if (this->maxStringWidth < iVar2) {
        this->maxStringWidth = iVar2;
      }
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_50);
  }
  return;
}

Assistant:

void
PickerPrivate::computeStringWidth()
{
	maxStringWidth = 25;

	const int rowCount = q->count();

	if( rowCount > 0 )
	{
		const QFontMetrics & fm = q->fontMetrics();

		for( int i = 0; i < rowCount; ++i )
		{
			const int width = fm.boundingRect( q->itemText( i ) ).width();

			if( width > maxStringWidth )
				maxStringWidth = width;
		}
	}
}